

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O3

void __thiscall cppcms::rpc::json_call::return_result(json_call *this,context *c,value *result)

{
  response *prVar1;
  ostream *poVar2;
  string local_50;
  
  prVar1 = http::context::response(c);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"application/json","");
  http::response::set_content_header(prVar1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  prVar1 = http::context::response(c);
  poVar2 = http::response::out(prVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\"id\":",6);
  poVar2 = json::operator<<(poVar2,&this->id_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",\"error\":null,\"result\":",0x17);
  poVar2 = json::operator<<(poVar2,result);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  return;
}

Assistant:

void json_call::return_result(http::context &c,json::value const &result)
	{
		c.response().set_content_header("application/json");
		c.response().out() <<
			"{\"id\":"<<id_<<",\"error\":null,\"result\":"<<result<<"}";
	}